

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

bool __thiscall
ProjectBuilderMakefileGenerator::writeMakefile(ProjectBuilderMakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  long lVar2;
  FILE *__stream;
  bool bVar3;
  ProStringList *pPVar4;
  QList<ProString> *pQVar5;
  long in_FS_OFFSET;
  ProKey PStack_f8;
  ProString local_c8;
  ProString local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_UnixMakefileGenerator).field_0xe1 = 0;
  pQVar1 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_FAILED_REQUIREMENTS");
  pPVar4 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
  lVar2 = (pPVar4->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  __stream = _stderr;
  if (lVar2 == 0) {
    pQVar1 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_68,"MAKEFILE");
    pQVar5 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68)->
              super_QList<ProString>;
    QList<ProString>::clear(pQVar5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    pQVar1 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_68,"MAKEFILE");
    pQVar5 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68)->
              super_QList<ProString>;
    ProString::ProString(&local_98,"Makefile");
    QList<ProString>::emplaceBack<ProString>(pQVar5,&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    pQVar1 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_98,"TEMPLATE");
    QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_98);
    bVar3 = ProString::operator==(&local_68,"app");
    if (bVar3) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    }
    else {
      pQVar1 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey(&PStack_f8,"TEMPLATE");
      QMakeEvaluator::first(&local_c8,&pQVar1->super_QMakeEvaluator,&PStack_f8);
      bVar3 = ProString::operator==(&local_c8,"lib");
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      if (!bVar3) {
        pQVar1 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey((ProKey *)&local_98,"TEMPLATE");
        QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_98);
        bVar3 = ProString::operator==(&local_68,"subdirs");
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        if (!bVar3) {
          bVar3 = false;
          goto LAB_00112841;
        }
        writeSubDirs(this,t);
        goto LAB_0011283f;
      }
    }
    writeMakeParts(this,t);
  }
  else {
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_FAILED_REQUIREMENTS");
    (*(this->super_UnixMakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_c8,this,&local_68);
    QString::toLatin1_helper_inplace((QString *)&local_98);
    if (local_98.m_string.d.ptr == (char16_t *)0x0) {
      local_98.m_string.d.ptr = (char16_t *)&QByteArray::_empty;
    }
    fprintf(__stream,"Project file not generated because all requirements not met:\n\t%s\n",
            local_98.m_string.d.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
LAB_0011283f:
  bVar3 = true;
LAB_00112841:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool
ProjectBuilderMakefileGenerator::writeMakefile(QTextStream &t)
{
    writingUnixMakefileGenerator = false;
    if(!project->values("QMAKE_FAILED_REQUIREMENTS").isEmpty()) {
        /* for now just dump, I need to generated an empty xml or something.. */
        fprintf(stderr, "Project file not generated because all requirements not met:\n\t%s\n",
                var("QMAKE_FAILED_REQUIREMENTS").toLatin1().constData());
        return true;
    }

    project->values("MAKEFILE").clear();
    project->values("MAKEFILE").append("Makefile");
    if(project->first("TEMPLATE") == "app" || project->first("TEMPLATE") == "lib")
        return writeMakeParts(t);
    else if(project->first("TEMPLATE") == "subdirs")
        return writeSubDirs(t);
    return false;
}